

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LightMask.hpp
# Opt level: O0

void __thiscall
LightMask::blur(LightMask *this,vector<float,_std::allocator<float>_> *from,
               vector<float,_std::allocator<float>_> *to,int rad)

{
  const_reference pvVar1;
  reference pvVar2;
  int local_3c;
  float avg;
  int ky;
  int kx;
  float sum;
  int j;
  int i;
  int numtiles;
  int rad_local;
  vector<float,_std::allocator<float>_> *to_local;
  vector<float,_std::allocator<float>_> *from_local;
  LightMask *this_local;
  
  for (sum = (float)rad; kx = rad, (int)sum < this->width_ - rad; sum = (float)((int)sum + 1)) {
    for (; kx < this->height_ - rad; kx = kx + 1) {
      ky = 0;
      for (avg = (float)((int)sum - rad); (int)avg <= (int)sum + rad; avg = (float)((int)avg + 1)) {
        for (local_3c = kx - rad; local_3c <= kx + rad; local_3c = local_3c + 1) {
          pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                             (from,(long)((int)avg + local_3c * this->width_));
          ky = (int)(*pvVar1 + (float)ky);
        }
      }
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         (to,(long)((int)sum + kx * this->width_));
      *pvVar2 = (float)ky / (float)((rad * 2 + 1) * (rad * 2 + 1));
    }
  }
  return;
}

Assistant:

void blur(const std::vector<float>& from, std::vector<float>& to, int rad)
    {
        // number of tiles in the kernel
        const int numtiles = ((2 * rad) + 1) * ((2 * rad) + 1);

        //std::vector<float> blur(width*height, 0.0f);
        for (int i = rad; i < width_-rad; i++)
        {
            for (int j = rad; j < height_-rad; j++)
            {
                // Compute the sum of all values in the kernel
                float sum = 0.0f;
                for (int kx = i-rad; kx <= i+rad; kx++)
                {
                    for (int ky = j-rad; ky <= j+rad; ky++)
                    {
                        sum += from[kx + ky * width_];
                    }
                }

                // Average the value
                float avg = sum / numtiles;
                to[i + j * width_] = avg;
            }
        }
    }